

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcSC3DMCDecoder.h
# Opt level: O0

void __thiscall
o3dgc::SC3DMCDecoder<unsigned_short>::SC3DMCDecoder(SC3DMCDecoder<unsigned_short> *this)

{
  SC3DMCDecoder<unsigned_short> *this_local;
  
  SC3DMCEncodeParams::SC3DMCEncodeParams(&this->m_params);
  TriangleListDecoder<unsigned_short>::TriangleListDecoder(&this->m_triangleListDecoder);
  Vector<char>::Vector(&this->m_orientation);
  SC3DMCStats::SC3DMCStats(&this->m_stats);
  this->m_iterator = 0;
  this->m_streamSize = 0;
  this->m_quantFloatArray = (long *)0x0;
  this->m_quantFloatArraySize = 0;
  this->m_normals = (Real *)0x0;
  this->m_normalsSize = 0;
  this->m_streamType = O3DGC_STREAM_TYPE_UNKOWN;
  return;
}

Assistant:

SC3DMCDecoder(void)
                                    {
                                        m_iterator            = 0;
                                        m_streamSize          = 0;
                                        m_quantFloatArray     = 0;
                                        m_quantFloatArraySize = 0;
                                        m_normals             = 0;
                                        m_normalsSize         = 0;
                                        m_streamType          = O3DGC_STREAM_TYPE_UNKOWN;
                                    }